

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O0

void pool_destroy_all(void)

{
  int iVar1;
  pool_t num_pools;
  pool_t pool_id;
  undefined1 auStack_8 [6];
  ushort local_2;
  
  iVar1 = prf_array_count((void *)0x115ebd);
  auStack_8 = (undefined1  [6])((uint6)(ushort)iVar1 << 0x20);
  _auStack_8 = CONCAT26(1,auStack_8);
  while (local_2 < (ushort)auStack_8._4_2_) {
    if (pools[local_2] != (pool_info_t)0x0) {
      pool_destroy(pool_id);
    }
    _auStack_8 = CONCAT26(local_2 + 1,auStack_8);
  }
  return;
}

Assistant:

void
pool_destroy_all(
    void )
{
    pool_t pool_id, num_pools;
    num_pools = prf_array_count( pools );
    for ( pool_id = 1; pool_id < num_pools; pool_id++ ) {
       if ( pools[ pool_id ] != NULL )
           pool_destroy( pool_id );
    }
}